

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

string * cmInstallTargetGenerator::GetInstallFilename
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,string *config,
                   NameType nameType)

{
  string *psVar1;
  bool bVar2;
  TargetType TVar3;
  string *local_268;
  string *importName;
  Names targetNames_1;
  Names targetNames;
  NameType nameType_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  string *fname;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 == EXECUTABLE) {
    cmGeneratorTarget::GetExecutableNames
              ((Names *)((long)&targetNames_1.SharedObject.field_2 + 8),target,config);
    if (nameType == NameImplib) {
      bVar2 = cmGeneratorTarget::GetImplibGNUtoMS
                        (target,config,(string *)((long)&targetNames.ImportReal.field_2 + 8),
                         __return_storage_ptr__,"${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      if (!bVar2) {
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,
                   (string *)(targetNames.ImportReal.field_2._M_local_buf + 8));
      }
    }
    else if (nameType == NameImplibReal) {
      bVar2 = cmGeneratorTarget::GetImplibGNUtoMS
                        (target,config,(string *)((long)&targetNames.ImportOutput.field_2 + 8),
                         __return_storage_ptr__,"${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      if (!bVar2) {
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,
                   (string *)(targetNames.ImportOutput.field_2._M_local_buf + 8));
      }
    }
    else if (nameType == NameReal) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 (string *)(targetNames.Output.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 (string *)(targetNames.Base.field_2._M_local_buf + 8));
    }
    cmGeneratorTarget::Names::~Names((Names *)((long)&targetNames_1.SharedObject.field_2 + 8));
  }
  else {
    cmGeneratorTarget::GetLibraryNames((Names *)&importName,target,config);
    if ((nameType == NameImplib) || (nameType == NameImplibReal)) {
      if (nameType == NameImplib) {
        psVar1 = &targetNames_1.ImportReal;
      }
      else {
        psVar1 = &targetNames_1.ImportOutput;
      }
      local_268 = (string *)((psVar1->field_2)._M_local_buf + 8);
      bVar2 = cmGeneratorTarget::GetImplibGNUtoMS
                        (target,config,local_268,__return_storage_ptr__,
                         "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      if (!bVar2) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_268);
      }
    }
    else if (nameType == NameSO) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 (string *)(targetNames_1.PDB.field_2._M_local_buf + 8));
    }
    else if (nameType == NameReal) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 (string *)(targetNames_1.Output.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 (string *)(targetNames_1.Base.field_2._M_local_buf + 8));
    }
    cmGeneratorTarget::Names::~Names((Names *)&importName);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetInstallFilename(
  cmGeneratorTarget const* target, const std::string& config,
  NameType nameType)
{
  std::string fname;
  // Compute the name of the library.
  if (target->GetType() == cmStateEnums::EXECUTABLE) {
    cmGeneratorTarget::Names targetNames = target->GetExecutableNames(config);
    if (nameType == NameImplib) {
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(config, targetNames.ImportLibrary, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = targetNames.ImportLibrary;
      }
    } else if (nameType == NameImplibReal) {
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(config, targetNames.ImportReal, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = targetNames.ImportReal;
      }
    } else if (nameType == NameReal) {
      // Use the canonical name.
      fname = targetNames.Real;
    } else {
      // Use the canonical name.
      fname = targetNames.Output;
    }
  } else {
    cmGeneratorTarget::Names targetNames = target->GetLibraryNames(config);
    if (nameType == NameImplib || nameType == NameImplibReal) {
      const auto& importName = nameType == NameImplib
        ? targetNames.ImportLibrary
        : targetNames.ImportReal;
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(config, importName, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = importName;
      }
    } else if (nameType == NameSO) {
      // Use the soname.
      fname = targetNames.SharedObject;
    } else if (nameType == NameReal) {
      // Use the real name.
      fname = targetNames.Real;
    } else {
      // Use the canonical name.
      fname = targetNames.Output;
    }
  }

  return fname;
}